

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::debugging_internal::ParseTemplateParamDecl(State *state)

{
  undefined4 uVar1;
  undefined4 uVar2;
  bool bVar3;
  undefined1 uVar4;
  State *in_RDI;
  ParseState copy;
  ComplexityGuard guard;
  State *in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb1;
  undefined1 in_stack_ffffffffffffffb2;
  undefined1 in_stack_ffffffffffffffb3;
  undefined1 in_stack_ffffffffffffffb5;
  undefined1 in_stack_ffffffffffffffb7;
  char *two_char_token;
  State *in_stack_ffffffffffffffd8;
  ComplexityGuard in_stack_ffffffffffffffe8;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  byte bVar5;
  
  anon_unknown_3::ComplexityGuard::ComplexityGuard
            ((ComplexityGuard *)&stack0xffffffffffffffe8,in_RDI);
  bVar3 = anon_unknown_3::ComplexityGuard::IsTooComplex((ComplexityGuard *)&stack0xffffffffffffffe8)
  ;
  if (bVar3) {
    bVar5 = 0;
  }
  else {
    uVar1 = (in_RDI->parse_state).mangled_idx;
    uVar2 = (in_RDI->parse_state).out_cur_idx;
    two_char_token = *(char **)&(in_RDI->parse_state).prev_name_idx;
    bVar3 = ParseTwoCharToken(in_stack_ffffffffffffffd8,two_char_token);
    if (bVar3) {
      bVar5 = 1;
    }
    else {
      (in_RDI->parse_state).mangled_idx = uVar1;
      (in_RDI->parse_state).out_cur_idx = uVar2;
      *(char **)&(in_RDI->parse_state).prev_name_idx = two_char_token;
      bVar3 = ParseTwoCharToken(in_stack_ffffffffffffffd8,two_char_token);
      if ((bVar3) && (bVar3 = ParseName(in_stack_ffffffffffffffe8.state_), bVar3)) {
        bVar3 = ParseTemplateArgs(in_stack_ffffffffffffffe8.state_);
        in_stack_ffffffffffffffb7 = Optional(bVar3);
        if ((bool)in_stack_ffffffffffffffb7) {
          bVar5 = 1;
          goto LAB_003b7a77;
        }
      }
      (in_RDI->parse_state).mangled_idx = uVar1;
      (in_RDI->parse_state).out_cur_idx = uVar2;
      *(char **)&(in_RDI->parse_state).prev_name_idx = two_char_token;
      uVar4 = ParseTwoCharToken(in_stack_ffffffffffffffd8,two_char_token);
      if (((bool)uVar4) &&
         (in_stack_ffffffffffffffb5 =
               ParseType((State *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8)),
         (bool)in_stack_ffffffffffffffb5)) {
        bVar5 = 1;
      }
      else {
        (in_RDI->parse_state).mangled_idx = uVar1;
        (in_RDI->parse_state).out_cur_idx = uVar2;
        *(char **)&(in_RDI->parse_state).prev_name_idx = two_char_token;
        bVar3 = ParseTwoCharToken(in_stack_ffffffffffffffd8,two_char_token);
        if (((bVar3) &&
            (bVar3 = ZeroOrMore((ParseFunc)
                                CONCAT17(in_stack_ffffffffffffffb7,
                                         CONCAT16(uVar4,CONCAT15(in_stack_ffffffffffffffb5,
                                                                 CONCAT14(bVar3,CONCAT13(
                                                  in_stack_ffffffffffffffb3,
                                                  CONCAT12(in_stack_ffffffffffffffb2,
                                                           CONCAT11(in_stack_ffffffffffffffb1,
                                                                    in_stack_ffffffffffffffb0)))))))
                                ,in_stack_ffffffffffffffa8), bVar3)) &&
           (bVar3 = ParseOneCharToken(in_stack_ffffffffffffffd8,
                                      (char)((ulong)two_char_token >> 0x38)), bVar3)) {
          bVar5 = 1;
        }
        else {
          (in_RDI->parse_state).mangled_idx = uVar1;
          (in_RDI->parse_state).out_cur_idx = uVar2;
          *(char **)&(in_RDI->parse_state).prev_name_idx = two_char_token;
          bVar3 = ParseTwoCharToken(in_stack_ffffffffffffffd8,two_char_token);
          if ((bVar3) && (bVar3 = ParseTemplateParamDecl(in_stack_ffffffffffffffe8.state_), bVar3))
          {
            bVar5 = 1;
          }
          else {
            (in_RDI->parse_state).mangled_idx = uVar1;
            (in_RDI->parse_state).out_cur_idx = uVar2;
            *(char **)&(in_RDI->parse_state).prev_name_idx = two_char_token;
            bVar5 = 0;
          }
        }
      }
    }
  }
LAB_003b7a77:
  anon_unknown_3::ComplexityGuard::~ComplexityGuard((ComplexityGuard *)&stack0xffffffffffffffe8);
  return (bool)(bVar5 & 1);
}

Assistant:

static bool ParseTemplateParamDecl(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  ParseState copy = state->parse_state;

  if (ParseTwoCharToken(state, "Ty")) {
    return true;
  }
  state->parse_state = copy;

  if (ParseTwoCharToken(state, "Tk") && ParseName(state) &&
      Optional(ParseTemplateArgs(state))) {
    return true;
  }
  state->parse_state = copy;

  if (ParseTwoCharToken(state, "Tn") && ParseType(state)) {
    return true;
  }
  state->parse_state = copy;

  if (ParseTwoCharToken(state, "Tt") &&
      ZeroOrMore(ParseTemplateParamDecl, state) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  state->parse_state = copy;

  if (ParseTwoCharToken(state, "Tp") && ParseTemplateParamDecl(state)) {
    return true;
  }
  state->parse_state = copy;

  return false;
}